

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_inter_pred_luma_vert_w16inp_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [12];
  long lVar29;
  ulong *puVar30;
  ulong *puVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  char cVar39;
  char cVar40;
  char cVar41;
  undefined4 uVar37;
  char cVar42;
  char cVar44;
  char cVar45;
  undefined4 uVar43;
  undefined4 uVar46;
  undefined1 auVar38 [16];
  undefined2 uVar54;
  undefined2 uVar55;
  undefined2 uVar56;
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined2 uVar70;
  undefined1 auVar66 [16];
  undefined2 uVar75;
  undefined1 auVar71 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  ulong *local_88;
  ulong *local_80;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  
  if (0 < wd) {
    uVar35 = *(ulong *)pi1_coeff;
    auVar102[0] = (char)uVar35;
    cVar39 = (char)(uVar35 >> 8);
    cVar40 = (char)(uVar35 >> 0x10);
    cVar41 = (char)(uVar35 >> 0x18);
    cVar42 = (char)(uVar35 >> 0x20);
    cVar44 = (char)(uVar35 >> 0x28);
    cVar45 = (char)(uVar35 >> 0x30);
    auVar121._8_6_ = 0;
    auVar121._0_8_ = uVar35;
    auVar121[0xe] = (char)(uVar35 >> 0x38);
    auVar121[0xf] = -((long)uVar35 < 0);
    auVar116._14_2_ = auVar121._14_2_;
    auVar116._8_5_ = 0;
    auVar116._0_8_ = uVar35;
    auVar116[0xd] = -(cVar45 < '\0');
    auVar108._13_3_ = auVar116._13_3_;
    auVar108._8_4_ = 0;
    auVar108._0_8_ = uVar35;
    auVar108[0xc] = cVar45;
    auVar88._12_4_ = auVar108._12_4_;
    auVar88._8_3_ = 0;
    auVar88._0_8_ = uVar35;
    auVar88[0xb] = -(cVar44 < '\0');
    auVar117._11_5_ = auVar88._11_5_;
    auVar117._8_2_ = 0;
    auVar117._0_8_ = uVar35;
    auVar117[10] = cVar44;
    auVar115._10_6_ = auVar117._10_6_;
    auVar115[8] = 0;
    auVar115._0_8_ = uVar35;
    auVar115[9] = -(cVar42 < '\0');
    auVar61._9_7_ = auVar115._9_7_;
    auVar61[8] = cVar42;
    auVar61._0_8_ = uVar35;
    auVar28._4_8_ = auVar61._8_8_;
    auVar28[3] = -(cVar41 < '\0');
    auVar28[2] = cVar41;
    auVar28[1] = -(cVar40 < '\0');
    auVar28[0] = cVar40;
    auVar102._4_12_ = auVar28;
    auVar102[3] = -(cVar39 < '\0');
    auVar102[2] = cVar39;
    auVar102[1] = -(auVar102[0] < '\0');
    uVar37 = auVar102._0_4_;
    uVar43 = auVar28._0_4_;
    uVar46 = auVar61._8_4_;
    auVar36._4_4_ = uVar37;
    auVar36._0_4_ = uVar37;
    auVar36._8_4_ = uVar37;
    auVar36._12_4_ = uVar37;
    auVar38._4_4_ = auVar88._12_4_;
    auVar38._0_4_ = auVar88._12_4_;
    auVar38._8_4_ = auVar88._12_4_;
    auVar38._12_4_ = auVar88._12_4_;
    lVar34 = (long)(dst_strd * 2);
    lVar29 = (long)dst_strd;
    lVar33 = (long)(dst_strd * 3);
    local_80 = (ulong *)(pi2_src + src_strd * 8);
    auVar121 = pmovsxbd(in_XMM15,0x20202020);
    local_88 = (ulong *)(pu1_dst + dst_strd * 4);
    uVar35 = 0;
    do {
      puVar30 = (ulong *)(pi2_src + uVar35);
      uVar1 = *(ulong *)((long)puVar30 + (long)(src_strd * -3) * 2);
      uVar2 = *(ulong *)((long)puVar30 + (long)(src_strd * -2) * 2);
      uVar55 = (undefined2)(uVar2 >> 0x30);
      auVar60._8_4_ = 0;
      auVar60._0_8_ = uVar1;
      auVar60._12_2_ = (short)(uVar1 >> 0x30);
      auVar60._14_2_ = uVar55;
      auVar59._12_4_ = auVar60._12_4_;
      auVar59._8_2_ = 0;
      auVar59._0_8_ = uVar1;
      uVar54 = (undefined2)(uVar2 >> 0x20);
      auVar59._10_2_ = uVar54;
      auVar58._10_6_ = auVar59._10_6_;
      auVar58._8_2_ = (short)(uVar1 >> 0x20);
      auVar58._0_8_ = uVar1;
      auVar57._8_8_ = auVar58._8_8_;
      uVar70 = (undefined2)(uVar2 >> 0x10);
      auVar57._6_2_ = uVar70;
      auVar57._4_2_ = (short)(uVar1 >> 0x10);
      auVar57._0_2_ = (undefined2)uVar1;
      auVar104._0_2_ = (undefined2)uVar2;
      auVar57._2_2_ = auVar104._0_2_;
      auVar61 = pmaddwd(auVar57,auVar36);
      uVar1 = *(ulong *)((long)puVar30 + (long)-src_strd * 2);
      uVar3 = *puVar30;
      uVar56 = (undefined2)(uVar1 >> 0x30);
      auVar107._8_4_ = 0;
      auVar107._0_8_ = uVar2;
      auVar107._12_2_ = uVar55;
      auVar107._14_2_ = uVar56;
      uVar55 = (undefined2)(uVar1 >> 0x20);
      auVar106._12_4_ = auVar107._12_4_;
      auVar106._8_2_ = 0;
      auVar106._0_8_ = uVar2;
      auVar106._10_2_ = uVar55;
      auVar105._10_6_ = auVar106._10_6_;
      auVar105._8_2_ = uVar54;
      auVar105._0_8_ = uVar2;
      uVar54 = (undefined2)(uVar1 >> 0x10);
      auVar104._8_8_ = auVar105._8_8_;
      auVar104._6_2_ = uVar54;
      auVar104._4_2_ = uVar70;
      auVar104._2_2_ = (short)uVar1;
      uVar75 = (undefined2)(uVar3 >> 0x30);
      auVar93._8_4_ = 0;
      auVar93._0_8_ = uVar1;
      auVar93._12_2_ = uVar56;
      auVar93._14_2_ = uVar75;
      uVar70 = (undefined2)(uVar3 >> 0x20);
      auVar92._12_4_ = auVar93._12_4_;
      auVar92._8_2_ = 0;
      auVar92._0_8_ = uVar1;
      auVar92._10_2_ = uVar70;
      auVar91._10_6_ = auVar92._10_6_;
      auVar91._8_2_ = uVar55;
      auVar91._0_8_ = uVar1;
      uVar56 = (undefined2)(uVar3 >> 0x10);
      auVar90._8_8_ = auVar91._8_8_;
      auVar90._6_2_ = uVar56;
      auVar90._4_2_ = uVar54;
      auVar80._0_2_ = (undefined2)uVar3;
      auVar90._2_2_ = auVar80._0_2_;
      auVar90._0_2_ = (short)uVar1;
      auVar12._4_4_ = uVar43;
      auVar12._0_4_ = uVar43;
      auVar12._8_4_ = uVar43;
      auVar12._12_4_ = uVar43;
      auVar102 = pmaddwd(auVar90,auVar12);
      uVar1 = *(ulong *)((long)puVar30 + (long)src_strd * 2);
      uVar2 = *(ulong *)((long)puVar30 + (long)(src_strd * 2) * 2);
      uVar55 = (undefined2)(uVar1 >> 0x30);
      auVar83._8_4_ = 0;
      auVar83._0_8_ = uVar3;
      auVar83._12_2_ = uVar75;
      auVar83._14_2_ = uVar55;
      uVar54 = (undefined2)(uVar1 >> 0x20);
      auVar82._12_4_ = auVar83._12_4_;
      auVar82._8_2_ = 0;
      auVar82._0_8_ = uVar3;
      auVar82._10_2_ = uVar54;
      auVar81._10_6_ = auVar82._10_6_;
      auVar81._8_2_ = uVar70;
      auVar81._0_8_ = uVar3;
      uVar70 = (undefined2)(uVar1 >> 0x10);
      auVar80._8_8_ = auVar81._8_8_;
      auVar80._6_2_ = uVar70;
      auVar80._4_2_ = uVar56;
      auVar76._0_2_ = (undefined2)uVar1;
      auVar80._2_2_ = auVar76._0_2_;
      uVar56 = (undefined2)(uVar2 >> 0x30);
      auVar79._8_4_ = 0;
      auVar79._0_8_ = uVar1;
      auVar79._12_2_ = uVar55;
      auVar79._14_2_ = uVar56;
      uVar55 = (undefined2)(uVar2 >> 0x20);
      auVar78._12_4_ = auVar79._12_4_;
      auVar78._8_2_ = 0;
      auVar78._0_8_ = uVar1;
      auVar78._10_2_ = uVar55;
      auVar77._10_6_ = auVar78._10_6_;
      auVar77._8_2_ = uVar54;
      auVar77._0_8_ = uVar1;
      uVar54 = (undefined2)(uVar2 >> 0x10);
      auVar76._8_8_ = auVar77._8_8_;
      auVar76._6_2_ = uVar54;
      auVar76._4_2_ = uVar70;
      auVar62._0_2_ = (undefined2)uVar2;
      auVar76._2_2_ = auVar62._0_2_;
      auVar20._4_4_ = uVar46;
      auVar20._0_4_ = uVar46;
      auVar20._8_4_ = uVar46;
      auVar20._12_4_ = uVar46;
      auVar115 = pmaddwd(auVar76,auVar20);
      uVar1 = *(ulong *)((long)puVar30 + (long)(src_strd * 3) * 2);
      uVar3 = *(ulong *)((long)puVar30 + (long)(src_strd * 4) * 2);
      uVar75 = (undefined2)(uVar1 >> 0x30);
      auVar65._8_4_ = 0;
      auVar65._0_8_ = uVar2;
      auVar65._12_2_ = uVar56;
      auVar65._14_2_ = uVar75;
      auVar64._12_4_ = auVar65._12_4_;
      auVar64._8_2_ = 0;
      auVar64._0_8_ = uVar2;
      uVar70 = (undefined2)(uVar1 >> 0x20);
      auVar64._10_2_ = uVar70;
      auVar63._10_6_ = auVar64._10_6_;
      auVar63._8_2_ = uVar55;
      auVar63._0_8_ = uVar2;
      auVar62._8_8_ = auVar63._8_8_;
      uVar56 = (undefined2)(uVar1 >> 0x10);
      auVar62._6_2_ = uVar56;
      auVar62._4_2_ = uVar54;
      auVar71._0_2_ = (undefined2)uVar1;
      auVar62._2_2_ = auVar71._0_2_;
      uVar55 = (undefined2)(uVar3 >> 0x30);
      auVar74._8_4_ = 0;
      auVar74._0_8_ = uVar1;
      auVar74._12_2_ = uVar75;
      auVar74._14_2_ = uVar55;
      uVar54 = (undefined2)(uVar3 >> 0x20);
      auVar73._12_4_ = auVar74._12_4_;
      auVar73._8_2_ = 0;
      auVar73._0_8_ = uVar1;
      auVar73._10_2_ = uVar54;
      auVar72._10_6_ = auVar73._10_6_;
      auVar72._8_2_ = uVar70;
      auVar72._0_8_ = uVar1;
      uVar70 = (undefined2)(uVar3 >> 0x10);
      auVar71._8_8_ = auVar72._8_8_;
      auVar71._6_2_ = uVar70;
      auVar71._4_2_ = uVar56;
      auVar66._0_2_ = (undefined2)uVar3;
      auVar71._2_2_ = auVar66._0_2_;
      auVar117 = pmaddwd(auVar71,auVar38);
      auVar118._0_4_ =
           (auVar117._0_4_ + auVar115._0_4_ + auVar102._0_4_ + auVar61._0_4_ >> 6) + auVar121._0_4_
           >> 6;
      auVar118._4_4_ =
           (auVar117._4_4_ + auVar115._4_4_ + auVar102._4_4_ + auVar61._4_4_ >> 6) + auVar121._4_4_
           >> 6;
      auVar118._8_4_ =
           (auVar117._8_4_ + auVar115._8_4_ + auVar102._8_4_ + auVar61._8_4_ >> 6) + auVar121._8_4_
           >> 6;
      auVar118._12_4_ =
           (auVar117._12_4_ + auVar115._12_4_ + auVar102._12_4_ + auVar61._12_4_ >> 6) +
           auVar121._12_4_ >> 6;
      auVar121 = packssdw(auVar118,auVar118);
      sVar4 = auVar121._0_2_;
      sVar5 = auVar121._2_2_;
      sVar6 = auVar121._4_2_;
      sVar7 = auVar121._6_2_;
      *(ulong *)(pu1_dst + uVar35) =
           (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar121[6] - (0xff < sVar7),
                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar121[4] - (0xff < sVar6),
                                    CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar121[2] -
                                             (0xff < sVar5),
                                             (0 < sVar4) * (sVar4 < 0x100) * auVar121[0] -
                                             (0xff < sVar4)))) |
           *(ulong *)(pu1_dst + uVar35) & 0xffffffff00000000;
      auVar121 = pmaddwd(auVar90,auVar36);
      auVar13._4_4_ = uVar43;
      auVar13._0_4_ = uVar43;
      auVar13._8_4_ = uVar43;
      auVar13._12_4_ = uVar43;
      auVar61 = pmaddwd(auVar76,auVar13);
      auVar21._4_4_ = uVar46;
      auVar21._0_4_ = uVar46;
      auVar21._8_4_ = uVar46;
      auVar21._12_4_ = uVar46;
      auVar102 = pmaddwd(auVar71,auVar21);
      uVar1 = *(ulong *)((long)puVar30 + (long)(src_strd * 5) * 2);
      uVar2 = *(ulong *)((long)puVar30 + (long)(src_strd * 6) * 2);
      uVar56 = (undefined2)(uVar1 >> 0x30);
      auVar69._8_4_ = 0;
      auVar69._0_8_ = uVar3;
      auVar69._12_2_ = uVar55;
      auVar69._14_2_ = uVar56;
      uVar55 = (undefined2)(uVar1 >> 0x20);
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._8_2_ = 0;
      auVar68._0_8_ = uVar3;
      auVar68._10_2_ = uVar55;
      auVar67._10_6_ = auVar68._10_6_;
      auVar67._8_2_ = uVar54;
      auVar67._0_8_ = uVar3;
      uVar54 = (undefined2)(uVar1 >> 0x10);
      auVar66._8_8_ = auVar67._8_8_;
      auVar66._6_2_ = uVar54;
      auVar66._4_2_ = uVar70;
      auVar47._0_2_ = (undefined2)uVar1;
      auVar66._2_2_ = auVar47._0_2_;
      uVar70 = (undefined2)(uVar2 >> 0x30);
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar1;
      auVar50._12_2_ = uVar56;
      auVar50._14_2_ = uVar70;
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._8_2_ = 0;
      auVar49._0_8_ = uVar1;
      uVar56 = (undefined2)(uVar2 >> 0x20);
      auVar49._10_2_ = uVar56;
      auVar48._10_6_ = auVar49._10_6_;
      auVar48._8_2_ = uVar55;
      auVar48._0_8_ = uVar1;
      auVar47._8_8_ = auVar48._8_8_;
      uVar55 = (undefined2)(uVar2 >> 0x10);
      auVar47._6_2_ = uVar55;
      auVar47._4_2_ = uVar54;
      auVar94._0_2_ = (undefined2)uVar2;
      auVar47._2_2_ = auVar94._0_2_;
      auVar115 = pmaddwd(auVar47,auVar38);
      auVar122._0_4_ =
           (auVar115._0_4_ + auVar102._0_4_ + auVar61._0_4_ + auVar121._0_4_ >> 6) + 0x20 >> 6;
      auVar122._4_4_ =
           (auVar115._4_4_ + auVar102._4_4_ + auVar61._4_4_ + auVar121._4_4_ >> 6) + 0x20 >> 6;
      auVar122._8_4_ =
           (auVar115._8_4_ + auVar102._8_4_ + auVar61._8_4_ + auVar121._8_4_ >> 6) + 0x20 >> 6;
      auVar122._12_4_ =
           (auVar115._12_4_ + auVar102._12_4_ + auVar61._12_4_ + auVar121._12_4_ >> 6) + 0x20 >> 6;
      auVar121 = packssdw(auVar122,auVar122);
      sVar4 = auVar121._0_2_;
      sVar5 = auVar121._2_2_;
      sVar6 = auVar121._4_2_;
      sVar7 = auVar121._6_2_;
      sVar8 = auVar121._8_2_;
      sVar9 = auVar121._10_2_;
      sVar10 = auVar121._12_2_;
      auVar123._0_7_ =
           CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar121[0xc] - (0xff < sVar10),
                    CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar121[10] - (0xff < sVar9),
                             CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar121[8] - (0xff < sVar8),
                                      CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar121[6] -
                                               (0xff < sVar7),
                                               CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar121[4]
                                                        - (0xff < sVar6),
                                                        CONCAT11((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar121[2] - (0xff < sVar5),
                                                                 (0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar121[0] - (0xff < sVar4)))))));
      sVar11 = auVar121._14_2_;
      auVar123[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar121[0xe] - (0xff < sVar11);
      auVar123[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar121[0] - (0xff < sVar4);
      auVar123[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar121[2] - (0xff < sVar5);
      auVar123[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar121[4] - (0xff < sVar6);
      auVar123[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar121[6] - (0xff < sVar7);
      auVar123[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar121[8] - (0xff < sVar8);
      auVar123[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar121[10] - (0xff < sVar9);
      auVar123[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar121[0xc] - (0xff < sVar10);
      auVar123[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar121[0xe] - (0xff < sVar11);
      auVar121 = pmovsxbd(auVar123,0x20202020);
      *(ulong *)(pu1_dst + lVar34 + uVar35) =
           (ulong)auVar123._0_7_ & 0xffffffff |
           *(ulong *)(pu1_dst + lVar34 + uVar35) & 0xffffffff00000000;
      auVar61 = pmaddwd(auVar104,auVar36);
      auVar14._4_4_ = uVar43;
      auVar14._0_4_ = uVar43;
      auVar14._8_4_ = uVar43;
      auVar14._12_4_ = uVar43;
      auVar115 = pmaddwd(auVar80,auVar14);
      auVar22._4_4_ = uVar46;
      auVar22._0_4_ = uVar46;
      auVar22._8_4_ = uVar46;
      auVar22._12_4_ = uVar46;
      auVar102 = pmaddwd(auVar62,auVar22);
      auVar117 = pmaddwd(auVar66,auVar38);
      auVar119._0_4_ =
           (auVar117._0_4_ + auVar102._0_4_ + auVar115._0_4_ + auVar61._0_4_ >> 6) + auVar121._0_4_
           >> 6;
      auVar119._4_4_ =
           (auVar117._4_4_ + auVar102._4_4_ + auVar115._4_4_ + auVar61._4_4_ >> 6) + auVar121._4_4_
           >> 6;
      auVar119._8_4_ =
           (auVar117._8_4_ + auVar102._8_4_ + auVar115._8_4_ + auVar61._8_4_ >> 6) + auVar121._8_4_
           >> 6;
      auVar119._12_4_ =
           (auVar117._12_4_ + auVar102._12_4_ + auVar115._12_4_ + auVar61._12_4_ >> 6) +
           auVar121._12_4_ >> 6;
      auVar61 = packssdw(auVar119,auVar119);
      sVar4 = auVar61._0_2_;
      sVar5 = auVar61._2_2_;
      sVar6 = auVar61._4_2_;
      sVar7 = auVar61._6_2_;
      *(ulong *)(pu1_dst + lVar29 + uVar35) =
           (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar61[6] - (0xff < sVar7),
                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar61[4] - (0xff < sVar6),
                                    CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar61[2] -
                                             (0xff < sVar5),
                                             (0 < sVar4) * (sVar4 < 0x100) * auVar61[0] -
                                             (0xff < sVar4)))) |
           *(ulong *)(pu1_dst + lVar29 + uVar35) & 0xffffffff00000000;
      auVar61 = pmaddwd(auVar80,auVar36);
      auVar15._4_4_ = uVar43;
      auVar15._0_4_ = uVar43;
      auVar15._8_4_ = uVar43;
      auVar15._12_4_ = uVar43;
      auVar102 = pmaddwd(auVar62,auVar15);
      auVar23._4_4_ = uVar46;
      auVar23._0_4_ = uVar46;
      auVar23._8_4_ = uVar46;
      auVar23._12_4_ = uVar46;
      auVar115 = pmaddwd(auVar66,auVar23);
      uVar1 = *(ulong *)((long)puVar30 + (long)(src_strd * 7) * 2);
      auVar97._8_4_ = 0;
      auVar97._0_8_ = uVar2;
      auVar97._12_2_ = uVar70;
      auVar97._14_2_ = (short)(uVar1 >> 0x30);
      auVar96._12_4_ = auVar97._12_4_;
      auVar96._8_2_ = 0;
      auVar96._0_8_ = uVar2;
      auVar96._10_2_ = (short)(uVar1 >> 0x20);
      auVar95._10_6_ = auVar96._10_6_;
      auVar95._8_2_ = uVar56;
      auVar95._0_8_ = uVar2;
      auVar94._8_8_ = auVar95._8_8_;
      auVar94._6_2_ = (short)(uVar1 >> 0x10);
      auVar94._4_2_ = uVar55;
      auVar94._2_2_ = (short)uVar1;
      auVar117 = pmaddwd(auVar94,auVar38);
      auVar120._0_4_ =
           (auVar117._0_4_ + auVar115._0_4_ + auVar102._0_4_ + auVar61._0_4_ >> 6) + auVar121._0_4_
           >> 6;
      auVar120._4_4_ =
           (auVar117._4_4_ + auVar115._4_4_ + auVar102._4_4_ + auVar61._4_4_ >> 6) + auVar121._4_4_
           >> 6;
      auVar120._8_4_ =
           (auVar117._8_4_ + auVar115._8_4_ + auVar102._8_4_ + auVar61._8_4_ >> 6) + auVar121._8_4_
           >> 6;
      auVar120._12_4_ =
           (auVar117._12_4_ + auVar115._12_4_ + auVar102._12_4_ + auVar61._12_4_ >> 6) +
           auVar121._12_4_ >> 6;
      auVar61 = packssdw(auVar120,auVar120);
      sVar4 = auVar61._0_2_;
      sVar5 = auVar61._2_2_;
      sVar6 = auVar61._4_2_;
      sVar7 = auVar61._6_2_;
      *(ulong *)(pu1_dst + lVar33 + uVar35) =
           (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar61[6] - (0xff < sVar7),
                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar61[4] - (0xff < sVar6),
                                    CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar61[2] -
                                             (0xff < sVar5),
                                             (0 < sVar4) * (sVar4 < 0x100) * auVar61[0] -
                                             (0xff < sVar4)))) |
           *(ulong *)(pu1_dst + lVar33 + uVar35) & 0xffffffff00000000;
      if (4 < ht) {
        iVar32 = 4;
        puVar30 = local_88;
        puVar31 = local_80;
        do {
          auVar61 = auVar47;
          auVar117 = pmaddwd(auVar76,auVar36);
          auVar16._4_4_ = uVar43;
          auVar16._0_4_ = uVar43;
          auVar16._8_4_ = uVar43;
          auVar16._12_4_ = uVar43;
          auVar108 = pmaddwd(auVar71,auVar16);
          auVar24._4_4_ = uVar46;
          auVar24._0_4_ = uVar46;
          auVar24._8_4_ = uVar46;
          auVar24._12_4_ = uVar46;
          auVar102 = pmaddwd(auVar61,auVar24);
          uVar2 = *puVar31;
          uVar55 = (undefined2)(uVar2 >> 0x30);
          auVar87._8_4_ = 0;
          auVar87._0_8_ = uVar1;
          auVar87._12_2_ = (short)(uVar1 >> 0x30);
          auVar87._14_2_ = uVar55;
          auVar86._12_4_ = auVar87._12_4_;
          auVar86._8_2_ = 0;
          auVar86._0_8_ = uVar1;
          uVar54 = (undefined2)(uVar2 >> 0x20);
          auVar86._10_2_ = uVar54;
          auVar85._10_6_ = auVar86._10_6_;
          auVar85._8_2_ = (short)(uVar1 >> 0x20);
          auVar85._0_8_ = uVar1;
          auVar84._8_8_ = auVar85._8_8_;
          uVar70 = (undefined2)(uVar2 >> 0x10);
          auVar84._6_2_ = uVar70;
          auVar84._4_2_ = (short)(uVar1 >> 0x10);
          auVar84._0_2_ = (undefined2)uVar1;
          auVar109._0_2_ = (undefined2)uVar2;
          auVar84._2_2_ = auVar109._0_2_;
          auVar115 = pmaddwd(auVar71,auVar36);
          auVar17._4_4_ = uVar43;
          auVar17._0_4_ = uVar43;
          auVar17._8_4_ = uVar43;
          auVar17._12_4_ = uVar43;
          auVar116 = pmaddwd(auVar61,auVar17);
          auVar88 = pmaddwd(auVar84,auVar38);
          auVar89._0_4_ =
               (auVar88._0_4_ + auVar102._0_4_ + auVar108._0_4_ + auVar117._0_4_ >> 6) +
               auVar121._0_4_ >> 6;
          auVar89._4_4_ =
               (auVar88._4_4_ + auVar102._4_4_ + auVar108._4_4_ + auVar117._4_4_ >> 6) +
               auVar121._4_4_ >> 6;
          auVar89._8_4_ =
               (auVar88._8_4_ + auVar102._8_4_ + auVar108._8_4_ + auVar117._8_4_ >> 6) +
               auVar121._8_4_ >> 6;
          auVar89._12_4_ =
               (auVar88._12_4_ + auVar102._12_4_ + auVar108._12_4_ + auVar117._12_4_ >> 6) +
               auVar121._12_4_ >> 6;
          auVar121 = packssdw(auVar89,auVar89);
          sVar4 = auVar121._0_2_;
          sVar5 = auVar121._2_2_;
          sVar6 = auVar121._4_2_;
          sVar7 = auVar121._6_2_;
          *puVar30 = (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar121[6] - (0xff < sVar7),
                                     CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar121[4] -
                                              (0xff < sVar6),
                                              CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar121[2] -
                                                       (0xff < sVar5),
                                                       (0 < sVar4) * (sVar4 < 0x100) * auVar121[0] -
                                                       (0xff < sVar4)))) |
                     *puVar30 & 0xffffffff00000000;
          auVar25._4_4_ = uVar46;
          auVar25._0_4_ = uVar46;
          auVar25._8_4_ = uVar46;
          auVar25._12_4_ = uVar46;
          auVar88 = pmaddwd(auVar84,auVar25);
          uVar1 = *(ulong *)((long)puVar31 + (long)src_strd * 2);
          auVar121 = pmaddwd(auVar62,auVar36);
          auVar18._4_4_ = uVar43;
          auVar18._0_4_ = uVar43;
          auVar18._8_4_ = uVar43;
          auVar18._12_4_ = uVar43;
          auVar117 = pmaddwd(auVar66,auVar18);
          uVar3 = *(ulong *)((long)puVar31 + (long)(src_strd * 2) * 2);
          uVar56 = (undefined2)(uVar1 >> 0x30);
          auVar112._8_4_ = 0;
          auVar112._0_8_ = uVar2;
          auVar112._12_2_ = uVar55;
          auVar112._14_2_ = uVar56;
          uVar55 = (undefined2)(uVar1 >> 0x20);
          auVar111._12_4_ = auVar112._12_4_;
          auVar111._8_2_ = 0;
          auVar111._0_8_ = uVar2;
          auVar111._10_2_ = uVar55;
          auVar110._10_6_ = auVar111._10_6_;
          auVar110._8_2_ = uVar54;
          auVar110._0_8_ = uVar2;
          uVar54 = (undefined2)(uVar1 >> 0x10);
          auVar109._8_8_ = auVar110._8_8_;
          auVar109._6_2_ = uVar54;
          auVar109._4_2_ = uVar70;
          auVar47._0_2_ = (undefined2)uVar1;
          auVar109._2_2_ = auVar47._0_2_;
          uVar70 = (undefined2)(uVar3 >> 0x30);
          auVar53._8_4_ = 0;
          auVar53._0_8_ = uVar1;
          auVar53._12_2_ = uVar56;
          auVar53._14_2_ = uVar70;
          auVar52._12_4_ = auVar53._12_4_;
          auVar52._8_2_ = 0;
          auVar52._0_8_ = uVar1;
          uVar56 = (undefined2)(uVar3 >> 0x20);
          auVar52._10_2_ = uVar56;
          auVar51._10_6_ = auVar52._10_6_;
          auVar51._8_2_ = uVar55;
          auVar51._0_8_ = uVar1;
          auVar47._8_8_ = auVar51._8_8_;
          uVar55 = (undefined2)(uVar3 >> 0x10);
          auVar47._6_2_ = uVar55;
          auVar47._4_2_ = uVar54;
          auVar98._0_2_ = (undefined2)uVar3;
          auVar47._2_2_ = auVar98._0_2_;
          auVar102 = pmaddwd(auVar47,auVar38);
          auVar103._0_4_ =
               (auVar102._0_4_ + auVar88._0_4_ + auVar116._0_4_ + auVar115._0_4_ >> 6) + 0x20 >> 6;
          auVar103._4_4_ =
               (auVar102._4_4_ + auVar88._4_4_ + auVar116._4_4_ + auVar115._4_4_ >> 6) + 0x20 >> 6;
          auVar103._8_4_ =
               (auVar102._8_4_ + auVar88._8_4_ + auVar116._8_4_ + auVar115._8_4_ >> 6) + 0x20 >> 6;
          auVar103._12_4_ =
               (auVar102._12_4_ + auVar88._12_4_ + auVar116._12_4_ + auVar115._12_4_ >> 6) + 0x20 >>
               6;
          auVar102 = packssdw(auVar103,auVar103);
          sVar4 = auVar102._0_2_;
          sVar5 = auVar102._2_2_;
          sVar6 = auVar102._4_2_;
          sVar7 = auVar102._6_2_;
          *(ulong *)((long)puVar30 + lVar34) =
               (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar102[6] - (0xff < sVar7),
                               CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar102[4] - (0xff < sVar6)
                                        ,CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar102[2] -
                                                  (0xff < sVar5),
                                                  (0 < sVar4) * (sVar4 < 0x100) * auVar102[0] -
                                                  (0xff < sVar4)))) |
               *(ulong *)((long)puVar30 + lVar34) & 0xffffffff00000000;
          auVar26._4_4_ = uVar46;
          auVar26._0_4_ = uVar46;
          auVar26._8_4_ = uVar46;
          auVar26._12_4_ = uVar46;
          auVar102 = pmaddwd(auVar94,auVar26);
          auVar124._0_4_ = auVar102._0_4_ + auVar117._0_4_ + auVar121._0_4_;
          auVar124._4_4_ = auVar102._4_4_ + auVar117._4_4_ + auVar121._4_4_;
          auVar124._8_4_ = auVar102._8_4_ + auVar117._8_4_ + auVar121._8_4_;
          auVar124._12_4_ = auVar102._12_4_ + auVar117._12_4_ + auVar121._12_4_;
          auVar102 = pmaddwd(auVar66,auVar36);
          auVar19._4_4_ = uVar43;
          auVar19._0_4_ = uVar43;
          auVar19._8_4_ = uVar43;
          auVar19._12_4_ = uVar43;
          auVar115 = pmaddwd(auVar94,auVar19);
          auVar117 = pmaddwd(auVar109,auVar38);
          auVar121 = pmovsxbd(auVar124,0x20202020);
          auVar113._0_4_ = (auVar117._0_4_ + auVar124._0_4_ >> 6) + auVar121._0_4_ >> 6;
          auVar113._4_4_ = (auVar117._4_4_ + auVar124._4_4_ >> 6) + auVar121._4_4_ >> 6;
          auVar113._8_4_ = (auVar117._8_4_ + auVar124._8_4_ >> 6) + auVar121._8_4_ >> 6;
          auVar113._12_4_ = (auVar117._12_4_ + auVar124._12_4_ >> 6) + auVar121._12_4_ >> 6;
          auVar117 = packssdw(auVar113,auVar113);
          sVar4 = auVar117._0_2_;
          sVar5 = auVar117._2_2_;
          sVar6 = auVar117._4_2_;
          sVar7 = auVar117._6_2_;
          *(ulong *)((long)puVar30 + lVar29) =
               (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar117[6] - (0xff < sVar7),
                               CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar117[4] - (0xff < sVar6)
                                        ,CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar117[2] -
                                                  (0xff < sVar5),
                                                  (0 < sVar4) * (sVar4 < 0x100) * auVar117[0] -
                                                  (0xff < sVar4)))) |
               *(ulong *)((long)puVar30 + lVar29) & 0xffffffff00000000;
          auVar27._4_4_ = uVar46;
          auVar27._0_4_ = uVar46;
          auVar27._8_4_ = uVar46;
          auVar27._12_4_ = uVar46;
          auVar117 = pmaddwd(auVar109,auVar27);
          uVar1 = *(ulong *)((long)puVar31 + (long)(src_strd * 3) * 2);
          auVar101._8_4_ = 0;
          auVar101._0_8_ = uVar3;
          auVar101._12_2_ = uVar70;
          auVar101._14_2_ = (short)(uVar1 >> 0x30);
          auVar100._12_4_ = auVar101._12_4_;
          auVar100._8_2_ = 0;
          auVar100._0_8_ = uVar3;
          auVar100._10_2_ = (short)(uVar1 >> 0x20);
          auVar99._10_6_ = auVar100._10_6_;
          auVar99._8_2_ = uVar56;
          auVar99._0_8_ = uVar3;
          auVar98._8_8_ = auVar99._8_8_;
          auVar98._6_2_ = (short)(uVar1 >> 0x10);
          auVar98._4_2_ = uVar55;
          auVar98._2_2_ = (short)uVar1;
          auVar88 = pmaddwd(auVar98,auVar38);
          auVar114._0_4_ =
               (auVar88._0_4_ + auVar117._0_4_ + auVar115._0_4_ + auVar102._0_4_ >> 6) +
               auVar121._0_4_ >> 6;
          auVar114._4_4_ =
               (auVar88._4_4_ + auVar117._4_4_ + auVar115._4_4_ + auVar102._4_4_ >> 6) +
               auVar121._4_4_ >> 6;
          auVar114._8_4_ =
               (auVar88._8_4_ + auVar117._8_4_ + auVar115._8_4_ + auVar102._8_4_ >> 6) +
               auVar121._8_4_ >> 6;
          auVar114._12_4_ =
               (auVar88._12_4_ + auVar117._12_4_ + auVar115._12_4_ + auVar102._12_4_ >> 6) +
               auVar121._12_4_ >> 6;
          auVar102 = packssdw(auVar114,auVar114);
          sVar4 = auVar102._0_2_;
          sVar5 = auVar102._2_2_;
          sVar6 = auVar102._4_2_;
          sVar7 = auVar102._6_2_;
          *(ulong *)((long)puVar30 + lVar33) =
               (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar102[6] - (0xff < sVar7),
                               CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar102[4] - (0xff < sVar6)
                                        ,CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar102[2] -
                                                  (0xff < sVar5),
                                                  (0 < sVar4) * (sVar4 < 0x100) * auVar102[0] -
                                                  (0xff < sVar4)))) |
               *(ulong *)((long)puVar30 + lVar33) & 0xffffffff00000000;
          iVar32 = iVar32 + 4;
          puVar31 = (ulong *)((long)puVar31 + (long)(src_strd * 4) * 2);
          puVar30 = (ulong *)((long)puVar30 + (long)(dst_strd * 4));
          auVar62 = auVar94;
          auVar66 = auVar109;
          auVar71 = auVar84;
          auVar76 = auVar61;
          auVar94 = auVar98;
        } while (iVar32 < ht);
      }
      uVar35 = uVar35 + 4;
      local_80 = local_80 + 1;
      local_88 = (ulong *)((long)local_88 + 4);
    } while (uVar35 < (uint)wd);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp_ssse3(WORD16 *pi2_src,
                                             UWORD8 *pu1_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    WORD16 *pi2_src_copy;
    UWORD8 *pu1_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i s0_8x16b, s1_8x16b, s2_8x16b, s3_8x16b, s4_8x16b, s5_8x16b, s6_8x16b, s8_8x16b, s9_8x16b;
    __m128i s2_0_16x8b, s2_1_16x8b, s2_2_16x8b, s2_3_16x8b, s2_4_16x8b, s2_5_16x8b, s2_6_16x8b, s2_7_16x8b, s2_8_16x8b, s2_9_16x8b, s2_10_16x8b;
    __m128i s3_0_16x8b, s3_1_16x8b, s3_2_16x8b, s3_3_16x8b, s3_4_16x8b;
    __m128i s4_0_16x8b, s4_1_16x8b, s4_2_16x8b, s4_3_16x8b, s4_4_16x8b;
    __m128i s10_8x16b, s11_8x16b, s12_8x16b, s13_8x16b, s14_8x16b, s15_8x16b, s16_8x16b, s18_8x16b, s19_8x16b;
    __m128i s20_8x16b, s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b, s26_8x16b, s28_8x16b, s29_8x16b;
    __m128i s30_8x16b, s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b, s36_8x16b, s38_8x16b, s39_8x16b;

    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b, sign_reg;

/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    zero_8x16b = _mm_setzero_si128();
    sign_reg =  _mm_cmpgt_epi8(zero_8x16b, s4_8x16b);
    s5_8x16b  = _mm_unpacklo_epi8(s4_8x16b, sign_reg);

    coeff0_1_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(0, 0, 0, 0));  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(1, 1, 1, 1));  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(2, 2, 2, 2));  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(3, 3, 3, 3));  /* pi1_coeff[4] */


/* seting values in register */
    offset_8x16b = _mm_set1_epi32(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_set_epi32(0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0x00000000);
    mask_high_96b = _mm_set_epi32(0x00000000, 0x00000000, 0x00000000, 0xFFFFFFFF);


    pi2_src_copy = pi2_src;
    pu1_dst_copy = pu1_dst;

/*  outer for loop starts from here */
    for(col = 0; col < wd; col += 4)
    {

        pi2_src = pi2_src_copy + col;
        pu1_dst = pu1_dst_copy + col;

        /*load 4 pixel values */
        s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pi2_src + (-3 * src_strd)));

        /*load 4 pixel values */
        s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (-2 * src_strd)));

        s3_0_16x8b = _mm_unpacklo_epi16(s2_0_16x8b, s2_1_16x8b);

        s0_8x16b = _mm_madd_epi16(s3_0_16x8b, coeff0_1_8x16b);

        /*load 4 pixel values */
        s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (-1 * src_strd)));

        /*load 4 pixel values */
        s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (0 * src_strd)));

        s3_1_16x8b = _mm_unpacklo_epi16(s2_2_16x8b, s2_3_16x8b);

        s1_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff2_3_8x16b);

        /*load 4 pixel values */
        s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (1 * src_strd)));

        /*load 4 pixel values */
        s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

        s3_2_16x8b = _mm_unpacklo_epi16(s2_4_16x8b, s2_5_16x8b);

        s2_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

        /*load 4 pixel values */
        s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (4 * src_strd)));

        s3_3_16x8b = _mm_unpacklo_epi16(s2_6_16x8b, s2_7_16x8b);

        s3_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff6_7_8x16b);

        s4_8x16b = _mm_add_epi32(s0_8x16b, s1_8x16b);
        s5_8x16b = _mm_add_epi32(s2_8x16b, s3_8x16b);
        s6_8x16b = _mm_add_epi32(s4_8x16b, s5_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s8_8x16b = _mm_srai_epi32(s6_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s9_8x16b = _mm_add_epi32(s8_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s8_8x16b = _mm_srai_epi32(s9_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s8_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s9_8x16b = _mm_packus_epi16(s8_8x16b, zero_8x16b);

        s4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
        s5_8x16b =  _mm_and_si128(s4_8x16b, mask_low_32b);
        s6_8x16b =  _mm_and_si128(s9_8x16b, mask_high_96b);
        s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 0*/
        _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

        /* ROW 2*/
        s20_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff0_1_8x16b);
        s21_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff2_3_8x16b);
        s22_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (5 * src_strd)));

        /*load 4 pixel values */
        s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (6 * src_strd)));

        s3_4_16x8b = _mm_unpacklo_epi16(s2_8_16x8b, s2_9_16x8b);

        s23_8x16b = _mm_madd_epi16(s3_4_16x8b, coeff6_7_8x16b);

        s24_8x16b = _mm_add_epi32(s20_8x16b, s21_8x16b);
        s25_8x16b = _mm_add_epi32(s22_8x16b, s23_8x16b);
        s26_8x16b = _mm_add_epi32(s24_8x16b, s25_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s28_8x16b = _mm_srai_epi32(s26_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s29_8x16b = _mm_add_epi32(s28_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s28_8x16b = _mm_srai_epi32(s29_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s28_8x16b = _mm_packs_epi32(s28_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s29_8x16b = _mm_packus_epi16(s28_8x16b, zero_8x16b);

        s24_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (2 * dst_strd)));
        s25_8x16b =  _mm_and_si128(s24_8x16b, mask_low_32b);
        s26_8x16b =  _mm_and_si128(s29_8x16b, mask_high_96b);
        s29_8x16b = _mm_or_si128(s25_8x16b, s26_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 2*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), s29_8x16b);


        /*ROW 1*/
        s4_0_16x8b = _mm_unpacklo_epi16(s2_1_16x8b, s2_2_16x8b);

        s10_8x16b = _mm_madd_epi16(s4_0_16x8b, coeff0_1_8x16b);

        s4_1_16x8b = _mm_unpacklo_epi16(s2_3_16x8b, s2_4_16x8b);

        s11_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff2_3_8x16b);

        s4_2_16x8b = _mm_unpacklo_epi16(s2_5_16x8b, s2_6_16x8b);

        s12_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff4_5_8x16b);

        s4_3_16x8b = _mm_unpacklo_epi16(s2_7_16x8b, s2_8_16x8b);

        s13_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff6_7_8x16b);

        s14_8x16b = _mm_add_epi32(s10_8x16b, s11_8x16b);
        s15_8x16b = _mm_add_epi32(s12_8x16b, s13_8x16b);
        s16_8x16b = _mm_add_epi32(s14_8x16b, s15_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s18_8x16b = _mm_srai_epi32(s16_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s19_8x16b = _mm_add_epi32(s18_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s18_8x16b = _mm_srai_epi32(s19_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s18_8x16b = _mm_packs_epi32(s18_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s19_8x16b = _mm_packus_epi16(s18_8x16b, zero_8x16b);

        s14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (dst_strd)));
        s15_8x16b =  _mm_and_si128(s14_8x16b, mask_low_32b);
        s16_8x16b =  _mm_and_si128(s19_8x16b, mask_high_96b);
        s19_8x16b = _mm_or_si128(s15_8x16b, s16_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 1*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd)), s19_8x16b);


        /* ROW 3*/
        s30_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff0_1_8x16b);
        s31_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff2_3_8x16b);
        s32_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (7 * src_strd)));

        s4_4_16x8b = _mm_unpacklo_epi16(s2_9_16x8b, s2_10_16x8b);

        s33_8x16b = _mm_madd_epi16(s4_4_16x8b, coeff6_7_8x16b);

        s34_8x16b = _mm_add_epi32(s30_8x16b, s31_8x16b);
        s35_8x16b = _mm_add_epi32(s32_8x16b, s33_8x16b);
        s36_8x16b = _mm_add_epi32(s34_8x16b, s35_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s38_8x16b = _mm_srai_epi32(s36_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s39_8x16b = _mm_add_epi32(s38_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s38_8x16b = _mm_srai_epi32(s39_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s38_8x16b = _mm_packs_epi32(s38_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s39_8x16b = _mm_packus_epi16(s38_8x16b, zero_8x16b);

        s34_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (3 * dst_strd)));
        s35_8x16b =  _mm_and_si128(s34_8x16b, mask_low_32b);
        s36_8x16b =  _mm_and_si128(s39_8x16b, mask_high_96b);
        s39_8x16b = _mm_or_si128(s35_8x16b, s36_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 2*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), s39_8x16b);

        pi2_src += (8 * src_strd);
        pu1_dst += (4 * dst_strd);

        for(row = 4; row < ht; row += 4)
        {

            s3_0_16x8b = s3_2_16x8b;
            s3_1_16x8b = s3_3_16x8b;
            s3_2_16x8b = s3_4_16x8b;

            s0_8x16b = _mm_madd_epi16(s3_0_16x8b, coeff0_1_8x16b);
            s1_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff2_3_8x16b);
            s2_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 4)th row*/
            s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src));

            s3_3_16x8b = _mm_unpacklo_epi16(s2_10_16x8b, s2_0_16x8b);
            s3_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_0_16x8b = s4_2_16x8b;
            s4_1_16x8b = s4_3_16x8b;
            s4_2_16x8b = s4_4_16x8b;

            s4_8x16b = _mm_add_epi32(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi32(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi32(s4_8x16b, s5_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s8_8x16b = _mm_srai_epi32(s6_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s9_8x16b = _mm_add_epi32(s8_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s8_8x16b = _mm_srai_epi32(s9_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s8_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s9_8x16b = _mm_packus_epi16(s8_8x16b, zero_8x16b);

            s4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
            s5_8x16b =  _mm_and_si128(s4_8x16b, mask_low_32b);
            s6_8x16b =  _mm_and_si128(s9_8x16b, mask_high_96b);
            s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 4*/
            _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

/* row + 2*/
            s20_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 5)th row*/
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + src_strd));

            /*load 4 pixel values from (cur_row + 6)th row*/
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

            /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
            s3_4_16x8b = _mm_unpacklo_epi16(s2_1_16x8b, s2_2_16x8b);

            s23_8x16b = _mm_madd_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi32(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi32(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi32(s24_8x16b, s25_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s28_8x16b = _mm_srai_epi32(s26_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s29_8x16b = _mm_add_epi32(s28_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s28_8x16b = _mm_srai_epi32(s29_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s28_8x16b = _mm_packs_epi32(s28_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s29_8x16b = _mm_packus_epi16(s28_8x16b, zero_8x16b);

            s24_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (2 * dst_strd)));
            s25_8x16b =  _mm_and_si128(s24_8x16b, mask_low_32b);
            s26_8x16b =  _mm_and_si128(s29_8x16b, mask_high_96b);
            s29_8x16b = _mm_or_si128(s25_8x16b, s26_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row+2)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), s29_8x16b);


/*row + 1*/
            s10_8x16b = _mm_madd_epi16(s4_0_16x8b, coeff0_1_8x16b);
            s11_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff2_3_8x16b);
            s12_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff4_5_8x16b);

            /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
            s4_3_16x8b = _mm_unpacklo_epi16(s2_0_16x8b, s2_1_16x8b);
            s13_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi32(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi32(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi32(s14_8x16b, s15_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s18_8x16b = _mm_srai_epi32(s16_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s19_8x16b = _mm_add_epi32(s18_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s18_8x16b = _mm_srai_epi32(s19_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s18_8x16b = _mm_packs_epi32(s18_8x16b, zero_8x16b);

            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s19_8x16b = _mm_packus_epi16(s18_8x16b, zero_8x16b);

            s14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
            s15_8x16b =  _mm_and_si128(s14_8x16b, mask_low_32b);
            s16_8x16b =  _mm_and_si128(s19_8x16b, mask_high_96b);
            s19_8x16b = _mm_or_si128(s15_8x16b, s16_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row + 1)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s19_8x16b);


/* row + 3*/
            s30_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 7)th row*/
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

            /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
            s4_4_16x8b = _mm_unpacklo_epi16(s2_2_16x8b, s2_3_16x8b);

            s33_8x16b = _mm_madd_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi32(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi32(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi32(s34_8x16b, s35_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s38_8x16b = _mm_srai_epi32(s36_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s39_8x16b = _mm_add_epi32(s38_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s38_8x16b = _mm_srai_epi32(s39_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s38_8x16b = _mm_packs_epi32(s38_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s39_8x16b = _mm_packus_epi16(s38_8x16b, zero_8x16b);

            s34_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (3 * dst_strd)));
            s35_8x16b =  _mm_and_si128(s34_8x16b, mask_low_32b);
            s36_8x16b =  _mm_and_si128(s39_8x16b, mask_high_96b);
            s39_8x16b = _mm_or_si128(s35_8x16b, s36_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row+3)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), s39_8x16b);

            s2_10_16x8b = s2_3_16x8b;

            pi2_src += 4 * src_strd; /* pointer update */
            pu1_dst += 4 * dst_strd; /* pointer update */
        }
    }

}